

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Issue.cpp
# Opt level: O3

string * __thiscall
jbcoin::to_string_abi_cxx11_(string *__return_storage_ptr__,jbcoin *this,Issue *ac)

{
  size_type *psVar1;
  ulong uVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  bool in_R9B;
  ulong *local_78;
  Currency *local_70;
  ulong local_68;
  long lStack_60;
  string local_58;
  string local_38;
  
  if (*(int *)(this + 0x14) == 0) {
    lVar3 = 6;
    do {
      lVar5 = lVar3;
      if (lVar5 == 10) goto LAB_001a353b;
      lVar3 = lVar5 + 1;
    } while (*(int *)(this + lVar5 * 4) == 0);
    if (3 < lVar5 - 6U) {
LAB_001a353b:
      to_string_abi_cxx11_(__return_storage_ptr__,this,&ac->currency);
      return __return_storage_ptr__;
    }
  }
  encodeToken_abi_cxx11_(&local_38,(jbcoin *)0x0,(char)this + '\x14',(void *)0x14,0,in_R9B);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_68 = *puVar7;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar7;
    local_78 = (ulong *)*plVar4;
  }
  local_70 = (Currency *)plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  to_string_abi_cxx11_(&local_58,this,local_70);
  uVar2 = (long)local_70->pn + local_58._M_string_length;
  uVar8 = 0xf;
  if (local_78 != &local_68) {
    uVar8 = local_68;
  }
  if (uVar8 < uVar2) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar9 = local_58.field_2._M_allocated_capacity;
    }
    if (uVar2 <= (ulong)uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
      goto LAB_001a35d3;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
LAB_001a35d3:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar9 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
to_string (Issue const& ac)
{
    if (isXRP (ac.account))
        return to_string (ac.currency);

    return to_string(ac.account) + "/" + to_string(ac.currency);
}